

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O0

void wasm::
     CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
     ::doEndLoop(HeapStoreOptimization *self,Expression **currp)

{
  BasicBlock *__from;
  value_type __to;
  bool bVar1;
  BasicBlock *__to_00;
  Loop *pLVar2;
  reference ppBVar3;
  mapped_type *this;
  reference ppBVar4;
  BasicBlock *origin;
  iterator __end0;
  iterator __begin0;
  mapped_type *__range3;
  mapped_type *origins;
  BasicBlock *loopStart;
  Loop *curr;
  BasicBlock *last;
  Expression **currp_local;
  HeapStoreOptimization *self_local;
  
  __from = (self->
           super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
           ).
           super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           .currBasicBlock;
  __to_00 = startBasicBlock(&(self->
                             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                             ).
                             super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                           );
  link(&(self->
        super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
        ).
        super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
       ,(char *)__from,(char *)__to_00);
  pLVar2 = Expression::cast<wasm::Loop>(*currp);
  bVar1 = IString::is(&(pLVar2->name).super_IString);
  if (bVar1) {
    ppBVar3 = std::
              vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
              ::back(&(self->
                      super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                      ).
                      super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                      .loopLastBlockStack);
    __to = *ppBVar3;
    this = std::
           map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>_>
           ::operator[](&(self->
                         super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
                         ).
                         super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
                         .branches,&pLVar2->name);
    __end0 = std::
             vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
             ::begin(this);
    origin = (BasicBlock *)
             std::
             vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
             ::end(this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>
                                       *)&origin), bVar1) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>
                ::operator*(&__end0);
      link(&(self->
            super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
            ).
            super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
           ,(char *)*ppBVar4,(char *)__to);
      __gnu_cxx::
      __normal_iterator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_**,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>
      ::operator++(&__end0);
    }
    std::
    map<wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>_>_>_>
    ::erase(&(self->
             super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
             ).
             super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
             .branches,&pLVar2->name);
  }
  std::
  vector<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*,_std::allocator<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>::BasicBlock_*>_>
  ::pop_back(&(self->
              super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
              ).
              super_CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>
              .loopLastBlockStack);
  return;
}

Assistant:

static void doEndLoop(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->link(last, self->startBasicBlock()); // fallthrough
    auto* curr = (*currp)->cast<Loop>();
    // branches to the top of the loop
    if (curr->name.is()) {
      auto* loopStart = self->loopLastBlockStack.back();
      auto& origins = self->branches[curr->name];
      for (auto* origin : origins) {
        self->link(origin, loopStart);
      }
      self->branches.erase(curr->name);
    }
    self->loopLastBlockStack.pop_back();
  }